

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O3

int ecp_mod_p255(mbedtls_mpi *N)

{
  mbedtls_mpi_uint *pmVar1;
  int iVar2;
  ulong uVar3;
  mbedtls_mpi M;
  mbedtls_mpi_uint Mp [6];
  mbedtls_mpi local_60;
  mbedtls_mpi_uint local_48 [7];
  
  iVar2 = 0;
  if (3 < N->n) {
    local_60.s = 1;
    uVar3 = N->n - 3;
    local_60.n = 5;
    if (uVar3 < 5) {
      local_60.n = uVar3;
    }
    local_60.p = local_48;
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    local_48[4] = 0;
    local_48[5] = 0;
    memcpy(local_60.p,N->p + 3,(ulong)(uint)((int)local_60.n << 3));
    iVar2 = mbedtls_mpi_shift_r(&local_60,0x3f);
    if (iVar2 == 0) {
      local_60.n = local_60.n + 1;
      iVar2 = mbedtls_mpi_set_bit(N,0xff,'\0');
      if (iVar2 == 0) {
        if (4 < N->n) {
          pmVar1 = N->p;
          uVar3 = 4;
          do {
            pmVar1[uVar3] = 0;
            uVar3 = uVar3 + 1;
          } while (uVar3 < N->n);
        }
        iVar2 = mbedtls_mpi_mul_int(&local_60,&local_60,0x13);
        if (iVar2 == 0) {
          iVar2 = mbedtls_mpi_add_abs(N,N,&local_60);
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int ecp_mod_p255( mbedtls_mpi *N )
{
    int ret;
    size_t i;
    mbedtls_mpi M;
    mbedtls_mpi_uint Mp[P255_WIDTH + 2];

    if( N->n < P255_WIDTH )
        return( 0 );

    /* M = A1 */
    M.s = 1;
    M.n = N->n - ( P255_WIDTH - 1 );
    if( M.n > P255_WIDTH + 1 )
        M.n = P255_WIDTH + 1;
    M.p = Mp;
    memset( Mp, 0, sizeof Mp );
    memcpy( Mp, N->p + P255_WIDTH - 1, M.n * sizeof( mbedtls_mpi_uint ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &M, 255 % ( 8 * sizeof( mbedtls_mpi_uint ) ) ) );
    M.n++; /* Make room for multiplication by 19 */

    /* N = A0 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( N, 255, 0 ) );
    for( i = P255_WIDTH; i < N->n; i++ )
        N->p[i] = 0;

    /* N = A0 + 19 * A1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &M, &M, 19 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_abs( N, N, &M ) );

cleanup:
    return( ret );
}